

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

void __thiscall CTPNMod::gen_code(CTPNMod *this,int discard,int for_condition)

{
  int iVar1;
  CTcGenTarg *pCVar2;
  int iVar3;
  _func_int **pp_Var4;
  ulong uVar5;
  ulong uVar6;
  CTcPrsNodeBase *this_00;
  
  uVar6 = (ulong)(uint)discard;
  iVar3 = CTcPrsNodeBase::is_const_int
                    (&((this->super_CTPNBin).super_CTPNBinBase.right_)->super_CTcPrsNodeBase,1);
  this_00 = &((this->super_CTPNBin).super_CTPNBinBase.left_)->super_CTcPrsNodeBase;
  if (iVar3 == 0) {
    iVar3 = CTcPrsNodeBase::is_const_int(this_00,0);
    if (iVar3 == 0) {
      CTPNBin::gen_binary(&this->super_CTPNBin,'+',discard,0);
      return;
    }
    this_00 = &((this->super_CTPNBin).super_CTPNBinBase.right_)->super_CTcPrsNodeBase;
    pp_Var4 = this_00->_vptr_CTcPrsNodeBase;
    uVar6 = 1;
    uVar5 = 1;
  }
  else {
    pp_Var4 = this_00->_vptr_CTcPrsNodeBase;
    uVar5 = (ulong)(uint)for_condition;
  }
  (**pp_Var4)(this_00,uVar6,uVar5);
  CTcGenTarg::write_op(G_cg,'\x01');
  pCVar2 = G_cg;
  iVar1 = G_cg->sp_depth_;
  iVar3 = iVar1 + 1;
  G_cg->sp_depth_ = iVar3;
  if (pCVar2->max_sp_depth_ <= iVar1) {
    pCVar2->max_sp_depth_ = iVar3;
  }
  return;
}

Assistant:

void CTPNMod::gen_code(int discard, int for_condition)
{
    /* if dividing by 1, we can skip the whole thing (except side effects) */
    if (right_->is_const_int(1))
    {
        /* 
         *   simply generate the left side for side effects; actually
         *   doing the arithmetic has no effect 
         */
        left_->gen_code(discard, for_condition);

        /* the result is zero */
        G_cg->write_op(OPC_PUSH_0);
        G_cg->note_push();
        return;
    }

    /* if the left side is zero, the result is always zero */
    if (left_->is_const_int(0))
    {
        /* evaluate the right for side effects, but discard the result */
        right_->gen_code(TRUE, TRUE);

        /* the result is zero */
        G_cg->write_op(OPC_PUSH_0);
        G_cg->note_push();
        return;
    }

    /* use generic processing */
    gen_binary(OPC_MOD, discard, FALSE);
}